

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputPFBDecodeStream.cpp
# Opt level: O2

void __thiscall InputPFBDecodeStream::ResetReadStatus(InputPFBDecodeStream *this)

{
  this->mHasTokenBuffer = false;
  this->mFoundEOF = false;
  this->mInSegmentReadIndex = 0;
  this->mSegmentSize = 0;
  this->mCurrentType = '\0';
  this->mInternalState = -(uint)(this->mStreamToDecode == (IByteReader *)0x0);
  return;
}

Assistant:

void InputPFBDecodeStream::ResetReadStatus()
{
	mInSegmentReadIndex = 0;
	mSegmentSize = 0;
	mCurrentType = 0;
	mHasTokenBuffer = false;
	mFoundEOF = false;
	mInternalState = (mStreamToDecode != NULL) ? PDFHummus::eSuccess:PDFHummus::eFailure;
}